

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void set_rate_correction_factor
               (AV1_COMP *cpi,int is_encode_stage,double factor,int width,int height)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  RATE_FACTOR_LEVEL rf_lvl;
  int update_default_rcf;
  RefreshFrameInfo *refresh_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  
  lVar1 = *in_RDI;
  iVar5 = 1;
  dVar4 = resize_rate_factor((FrameDimensionCfg *)(in_RDI + 0x8467),in_EDX,in_ECX);
  dVar4 = fclamp(in_XMM0_Qa / dVar4,0.005,50.0);
  if ((char)in_RDI[0x77f0] == '\0') {
    *(double *)(lVar1 + 0xad20) = dVar4;
  }
  else {
    iVar3 = is_stat_consumption_stage((AV1_COMP *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
    if (iVar3 == 0) {
      if ((((((*(byte *)((long)in_RDI + 0x42d7a) & 1) == 0) &&
            ((*(byte *)(in_RDI + 0x85af) & 1) == 0)) || ((int)in_RDI[0xc0f5] != 0)) ||
          (*(int *)(*in_RDI + 0xc750) != 0)) ||
         ((*(int *)((long)in_RDI + 0x423dc) == 1 && (*(uint *)((long)in_RDI + 0x423bc) < 0x15)))) {
        if ((in_ESI != 0) &&
           (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4))) {
          in_RDI[0xc10f] = (long)dVar4;
          iVar5 = 0;
        }
        if (iVar5 != 0) {
          *(double *)(lVar1 + 0xad08) = dVar4;
        }
      }
      else {
        *(double *)(lVar1 + 0xad18) = dVar4;
      }
    }
    else {
      bVar2 = get_rate_factor_level((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      if ((in_ESI != 0) && (0 < *(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4)))
      {
        in_RDI[(ulong)bVar2 + 0xc10f] = (long)dVar4;
        iVar5 = 0;
      }
      if (iVar5 != 0) {
        *(double *)(lVar1 + 0xad08 + (ulong)bVar2 * 8) = dVar4;
      }
    }
  }
  return;
}

Assistant:

static void set_rate_correction_factor(AV1_COMP *cpi, int is_encode_stage,
                                       double factor, int width, int height) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  int update_default_rcf = 1;
  // Normalize RCF to account for the size-dependent scaling factor.
  factor /= resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height);

  factor = fclamp(factor, MIN_BPB_FACTOR, MAX_BPB_FACTOR);

  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    p_rc->rate_correction_factors[KF_STD] = factor;
  } else if (is_stat_consumption_stage(cpi)) {
    const RATE_FACTOR_LEVEL rf_lvl =
        get_rate_factor_level(&cpi->ppi->gf_group, cpi->gf_frame_index);
    if (is_encode_stage &&
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      rc->frame_level_rate_correction_factors[rf_lvl] = factor;
      update_default_rcf = 0;
    }
    if (update_default_rcf) p_rc->rate_correction_factors[rf_lvl] = factor;
  } else {
    if ((refresh_frame->alt_ref_frame || refresh_frame->golden_frame) &&
        !rc->is_src_frame_alt_ref && !cpi->ppi->use_svc &&
        (cpi->oxcf.rc_cfg.mode != AOM_CBR ||
         cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 20)) {
      p_rc->rate_correction_factors[GF_ARF_STD] = factor;
    } else {
      if (is_encode_stage &&
          cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
        rc->frame_level_rate_correction_factors[INTER_NORMAL] = factor;
        update_default_rcf = 0;
      }
      if (update_default_rcf)
        p_rc->rate_correction_factors[INTER_NORMAL] = factor;
    }
  }
}